

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCInst.c
# Opt level: O1

void MCInst_Init(MCInst *inst)

{
  long lVar1;
  
  lVar1 = 0x14;
  do {
    *(undefined1 *)((long)&((MCInst *)(inst->Operands + -1))->OpcodePub + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x314);
  inst->Opcode = 0;
  inst->OpcodePub = 0;
  *(undefined4 *)((long)&inst->OpcodePub + 3) = 0;
  inst->writeback = false;
  inst->ac_idx = '\0';
  inst->popcode_adjust = '\0';
  inst->assembly[0] = '\0';
  return;
}

Assistant:

void MCInst_Init(MCInst *inst)
{
	unsigned int i;

	for (i = 0; i < 48; i++) {
		inst->Operands[i].Kind = kInvalid;
	}

	inst->Opcode = 0;
	inst->OpcodePub = 0;
	inst->size = 0;
	inst->has_imm = false;
	inst->op1_size = 0;
	inst->writeback = false;
	inst->ac_idx = 0;
	inst->popcode_adjust = 0;
	inst->assembly[0] = '\0';
}